

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

GraphId absl::lts_20250127::DebugOnlyDeadlockCheck(Mutex *mu)

{
  GraphId GVar1;
  uint uVar2;
  int iVar3;
  void **pcs_00;
  bool bVar4;
  int iVar5;
  int n;
  SynchLocksHeld *pSVar6;
  GraphId id;
  void *pvVar7;
  char *buf;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  SynchLocksHeld *pSVar13;
  ulong uVar14;
  bool bVar15;
  SpinLockHolder lock;
  void *pcs [40];
  void **local_178 [41];
  
  if ((_ZN4absl12lts_2025012712_GLOBAL__N_124synch_deadlock_detectionE_0 == 0) ||
     (_ZN4absl12lts_2025012712_GLOBAL__N_124synch_deadlock_detectionE_0 == 0)) {
    id.handle = 0;
  }
  else {
    pSVar6 = Synch_GetAllLocks();
    uVar2 = deadlock_graph_mu;
    if ((deadlock_graph_mu & 1) == 0) {
      deadlock_graph_mu = deadlock_graph_mu | 1;
      LOCK();
      UNLOCK();
    }
    if ((uVar2 & 1) != 0) {
      base_internal::SpinLock::SlowLock((SpinLock *)&deadlock_graph_mu);
    }
    id = GetGraphIdLocked(mu);
    if ((pSVar6->n != 0) &&
       (synchronization_internal::GraphCycles::UpdateStackTrace
                  (deadlock_graph,id,pSVar6->n + 1,anon_unknown_11::GetStack), pSVar6->n != 0)) {
      uVar9 = 0;
      do {
        GVar1.handle = pSVar6->locks[uVar9].id.handle;
        pvVar7 = synchronization_internal::GraphCycles::Ptr(deadlock_graph,GVar1);
        if (pvVar7 == (void *)0x0) {
          bVar15 = false;
        }
        else {
          bVar4 = synchronization_internal::GraphCycles::InsertEdge(deadlock_graph,GVar1,id);
          bVar15 = false;
          if (!bVar4) {
            buf = (char *)base_internal::LowLevelAlloc::Alloc(0x1828);
            iVar3 = DeadlockCheck(absl::lts_20250127::Mutex*)::number_of_reported_deadlocks;
            DeadlockCheck(absl::lts_20250127::Mutex*)::number_of_reported_deadlocks =
                 DeadlockCheck(absl::lts_20250127::Mutex*)::number_of_reported_deadlocks + 1;
            iVar5 = GetStackTrace(local_178,0x28,2);
            StackString(local_178,iVar5,buf,0x17d4,iVar3 < 2);
            raw_log_internal::RawLog(kError,"mutex.cc",0x592,"Potential Mutex deadlock: %s",buf);
            if (pSVar6->n != 0) {
              uVar12 = 0;
              lVar10 = 0;
              pSVar13 = pSVar6;
              do {
                pSVar13 = (SynchLocksHeld *)&pSVar13->locks[0].id;
                pvVar7 = synchronization_internal::GraphCycles::Ptr
                                   (deadlock_graph,(GraphId)((GraphId *)pSVar13)->handle);
                if (pvVar7 != (void *)0x0) {
                  snprintf(buf + lVar10,0x17d4 - lVar10," %p",pvVar7);
                  sVar8 = strlen(buf + lVar10);
                  lVar10 = lVar10 + sVar8;
                }
                uVar12 = uVar12 + 1;
              } while (uVar12 != (uint)pSVar6->n);
            }
            raw_log_internal::RawLog
                      (kError,"mutex.cc",0x59e,
                       "Acquiring absl::Mutex %p while holding %s; a cycle in the historical lock ordering graph has been observed"
                       ,mu,buf);
            raw_log_internal::RawLog(kError,"mutex.cc",0x59f,"Cycle: ");
            iVar5 = synchronization_internal::GraphCycles::FindPath
                              (deadlock_graph,id,GVar1,10,(GraphId *)(buf + 0x17d8));
            if (iVar5 != 0) {
              uVar12 = (ulong)(iVar5 - 1);
              if (8 < uVar12) {
                uVar12 = 9;
              }
              uVar14 = 0xffffffffffffffff;
              do {
                GVar1.handle = *(uint64_t *)(buf + uVar14 * 8 + 0x17e0);
                pvVar7 = synchronization_internal::GraphCycles::Ptr(deadlock_graph,GVar1);
                if (pvVar7 != (void *)0x0) {
                  n = synchronization_internal::GraphCycles::GetStackTrace
                                (deadlock_graph,GVar1,local_178);
                  snprintf(buf,0x17d4,"mutex@%p stack: ",pvVar7);
                  pcs_00 = local_178[0];
                  sVar8 = strlen(buf);
                  StackString(pcs_00,n,buf + sVar8,0x17d4 - (int)sVar8,iVar3 < 2);
                  raw_log_internal::RawLog(kError,"mutex.cc",0x5ad,"%s",buf);
                }
                uVar14 = uVar14 + 1;
              } while (uVar12 != uVar14);
            }
            if (10 < iVar5) {
              raw_log_internal::RawLog(kError,"mutex.cc",0x5b0,"(long cycle; list truncated)");
            }
            uVar2 = deadlock_graph_mu;
            if (_ZN4absl12lts_2025012712_GLOBAL__N_124synch_deadlock_detectionE_0 == 2) {
              uVar11 = deadlock_graph_mu & 2;
              LOCK();
              UNLOCK();
              bVar15 = 7 < deadlock_graph_mu;
              deadlock_graph_mu = uVar11;
              if (bVar15) {
                base_internal::SpinLock::SlowUnlock((SpinLock *)&deadlock_graph_mu,uVar2);
              }
              raw_log_internal::RawLog(kFatal,"mutex.cc",0x5b5,"dying due to potential deadlock");
              __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/synchronization/mutex.cc"
                            ,0x5b5,"GraphId absl::DeadlockCheck(Mutex *)");
            }
            bVar15 = true;
            base_internal::LowLevelAlloc::Free(buf);
          }
        }
      } while ((!bVar15) && (uVar9 = uVar9 + 1, uVar9 != (uint)pSVar6->n));
    }
    uVar2 = deadlock_graph_mu;
    uVar11 = deadlock_graph_mu & 2;
    LOCK();
    UNLOCK();
    bVar15 = 7 < deadlock_graph_mu;
    deadlock_graph_mu = uVar11;
    if (bVar15) {
      base_internal::SpinLock::SlowUnlock((SpinLock *)&deadlock_graph_mu,uVar2);
    }
  }
  return (GraphId)id.handle;
}

Assistant:

static inline GraphId DebugOnlyDeadlockCheck(Mutex* mu) {
  if (kDebugMode && synch_deadlock_detection.load(std::memory_order_acquire) !=
                        OnDeadlockCycle::kIgnore) {
    return DeadlockCheck(mu);
  } else {
    return InvalidGraphId();
  }
}